

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

TweakPrivkeyData * __thiscall
cfd::js::api::json::TweakPrivkeyData::GetPrivkeyString_abi_cxx11_
          (TweakPrivkeyData *this,TweakPrivkeyData *obj)

{
  TweakPrivkeyData *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->privkey_);
  return this;
}

Assistant:

static std::string GetPrivkeyString(  // line separate
      const TweakPrivkeyData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.privkey_);
  }